

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurrentGenerator.cpp
# Opt level: O0

Event * __thiscall CurrentGenerator::update(CurrentGenerator *this,double n_dt)

{
  long in_RDI;
  CurrentEvent *this_00;
  double dVar1;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *in_stack_ffffffffffffff88;
  normal_distribution<double> *in_stack_ffffffffffffff90;
  double in_stack_ffffffffffffffb0;
  double in_stack_ffffffffffffffb8;
  double n_current;
  CurrentEvent *in_stack_ffffffffffffffc0;
  Event *local_8;
  
  if (*(double *)(*(long *)(in_RDI + 0x28) + 0x20) <= 0.0) {
    local_8 = (Event *)operator_new(0x28);
    std::normal_distribution<double>::operator()
              ((normal_distribution<double> *)**(undefined8 **)(in_RDI + 0x28),
               (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)local_8);
    CurrentEvent::CurrentEvent
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  }
  else {
    local_8 = (Event *)operator_new(0x28);
    n_current = **(double **)(in_RDI + 0x28);
    this_00 = (CurrentEvent *)((*(double **)(in_RDI + 0x28))[4] * 6.2831853071794);
    dVar1 = Clock::getCurrentTime(*(Clock **)(in_RDI + 0x58));
    sin((double)this_00 * dVar1);
    std::normal_distribution<double>::operator()
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    CurrentEvent::CurrentEvent(this_00,n_current,(double)local_8);
  }
  return local_8;
}

Assistant:

Event* CurrentGenerator::update(double n_dt) {
    if(param->ac_hz > 0) {
        return new CurrentEvent(param->I + sin(2*3.1415926535897*param->ac_hz*clock->getCurrentTime()) + distribution(generator)*param->noiseOn, 1.0);
    }
    return new CurrentEvent(param->I + distribution(generator)*param->noiseOn, 1.0);
}